

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O1

void __thiscall ANN::load(ANN *this,string *filepath,bool reinitialize)

{
  int iVar1;
  int iVar2;
  pointer pLVar3;
  pointer pLVar4;
  int *piVar5;
  char *pcVar6;
  char cVar7;
  double dVar8;
  long lVar9;
  double *pdVar10;
  undefined8 uVar11;
  undefined7 in_register_00000011;
  uint uVar12;
  ulong uVar13;
  uint n_col;
  pointer this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> n_perceptrons;
  string line;
  Matrix weight;
  ifstream file;
  stringstream stream;
  undefined1 auStack_478 [8];
  int *local_470;
  ANN *local_468;
  undefined4 local_45c;
  double local_458;
  char *local_450;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_448;
  ulong local_428;
  char *local_420;
  undefined8 local_418;
  char local_410;
  undefined7 uStack_40f;
  ulong local_400;
  ulong local_3f8;
  long local_3f0;
  Matrix local_3e8;
  long local_3c0 [4];
  byte abStack_3a0 [488];
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  local_45c = (undefined4)CONCAT71(in_register_00000011,reinitialize);
  local_468 = this;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_420 = &local_410;
  local_418 = 0;
  local_410 = '\0';
  local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3e8.m_vals.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3e8.m_vals.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3e8.m_vals.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::ifstream::ifstream(local_3c0,(string *)filepath,_S_in);
  if ((abStack_3a0[*(long *)(local_3c0[0] + -0x18)] & 5) == 0) {
    cVar7 = std::ios::widen((char)auStack_478 + (char)*(long *)(local_3c0[0] + -0x18) + -0x48);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_3c0,(string *)&local_420,cVar7);
    pcVar6 = local_420;
    local_470 = __errno_location();
    iVar1 = *local_470;
    *local_470 = 0;
    dVar8 = (double)strtol(pcVar6,&local_450,10);
    if (local_450 == pcVar6) {
      std::__throw_invalid_argument("stoi");
    }
    else if (((double)(long)SUB84(dVar8,0) == dVar8) && (*local_470 != 0x22)) {
      if (*local_470 == 0) {
        *local_470 = iVar1;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&local_448,(ulong)dVar8 & 0xffffffff);
      if ((char)local_45c != '\0') {
        pLVar3 = (local_468->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pLVar4 = (local_468->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        this_00 = pLVar3;
        if (pLVar4 != pLVar3) {
          do {
            Layer::~Layer(this_00);
            this_00 = this_00 + 1;
          } while (this_00 != pLVar4);
          (local_468->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
          super__Vector_impl_data._M_finish = pLVar3;
        }
      }
      local_458 = dVar8;
      if (SUB84(dVar8,0) != 0) {
        uVar13 = 0;
        do {
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_3c0,(string *)&local_420,',');
          pcVar6 = local_420;
          iVar1 = *local_470;
          *local_470 = 0;
          lVar9 = strtol(local_420,&local_450,10);
          if (local_450 == pcVar6) goto LAB_00103fe5;
          if ((lVar9 - 0x80000000U < 0xffffffff00000000) || (*local_470 == 0x22)) goto LAB_00103ff1;
          if (*local_470 == 0) {
            *local_470 = iVar1;
          }
          local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar13] = (uint)lVar9;
          if ((char)local_45c != '\0') {
            insert_layer(local_468,(uint)uVar13,(uint)lVar9);
          }
          uVar13 = uVar13 + 1;
        } while (((ulong)dVar8 & 0xffffffff) != uVar13);
      }
      local_400 = (ulong)(SUB84(local_458,0) - 1);
      uVar13 = 0;
      do {
        if (uVar13 == local_400) {
          std::ifstream::close();
          std::ifstream::~ifstream(local_3c0);
          Matrix::~Matrix(&local_3e8);
          if (local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_448.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_448.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_448.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_420 != &local_410) {
            operator_delete(local_420,CONCAT71(uStack_40f,local_410) + 1);
          }
          std::__cxx11::stringstream::~stringstream(local_1b8);
          std::ios_base::~ios_base(local_138);
          return;
        }
        if ((char)local_45c != '\0') {
          Matrix::set_shape(&(local_468->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar13].m_weights,
                            local_448.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar13 + 1],
                            local_448.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar13]);
          Matrix::set_shape(&(local_468->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar13].m_biases,1,
                            local_448.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar13 + 1]);
        }
        local_3f8 = uVar13 + 1;
        local_428 = local_3f8 & 0xffffffff;
        if (local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[local_428] != 0) {
          uVar12 = 0;
          local_3f0 = uVar13 * 0x58;
          do {
            if (local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar13] != 0) {
              n_col = 0;
              do {
                std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)local_3c0,(string *)&local_420,',');
                pcVar6 = local_420;
                piVar5 = local_470;
                iVar1 = *local_470;
                *local_470 = 0;
                dVar8 = strtod(local_420,&local_450);
                if (local_450 == pcVar6) {
                  std::__throw_invalid_argument("stod");
LAB_00103fc1:
                  std::__throw_out_of_range("stod");
                  goto LAB_00103fcd;
                }
                iVar2 = *piVar5;
                if (iVar2 == 0) {
                  *piVar5 = iVar1;
                }
                else if (iVar2 == 0x22) goto LAB_00103fc1;
                local_458 = dVar8;
                pdVar10 = Matrix::set((Matrix *)
                                      ((long)&(((local_468->m_layers).
                                                super__Vector_base<Layer,_std::allocator<Layer>_>.
                                                _M_impl.super__Vector_impl_data._M_start)->m_weights
                                              ).m_vals.
                                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      + local_3f0),uVar12,n_col);
                *pdVar10 = local_458;
                n_col = n_col + 1;
              } while (n_col < local_448.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar13]);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 < local_448.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[local_428]);
        }
        if (local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[local_428] != 0) {
          uVar12 = 0;
          do {
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_3c0,(string *)&local_420,',');
            pcVar6 = local_420;
            piVar5 = local_470;
            iVar1 = *local_470;
            *local_470 = 0;
            dVar8 = strtod(local_420,&local_450);
            if (local_450 == pcVar6) goto LAB_00103fcd;
            iVar2 = *piVar5;
            if (iVar2 == 0) {
              *piVar5 = iVar1;
            }
            else if (iVar2 == 0x22) goto LAB_00103fd9;
            local_458 = dVar8;
            pdVar10 = Matrix::set(&(local_468->m_layers).
                                   super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                                   super__Vector_impl_data._M_start[uVar13].m_biases,0,uVar12);
            *pdVar10 = local_458;
            uVar12 = uVar12 + 1;
          } while (uVar12 < local_448.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[local_428]);
        }
        cVar7 = std::ios::widen((char)*(undefined8 *)(local_3c0[0] + -0x18) + (char)local_3c0);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_3c0,(string *)&local_420,cVar7);
        uVar13 = local_3f8;
      } while( true );
    }
    uVar11 = std::__throw_out_of_range("stoi");
    Matrix::~Matrix(&local_3e8);
    if (local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_448.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_448.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_420 != &local_410) {
      operator_delete(local_420,CONCAT71(uStack_40f,local_410) + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    _Unwind_Resume(uVar11);
  }
LAB_00103ffd:
  std::operator<<((ostream *)&std::cout,"ERROR [weight file]: Couldn\'t load weights!\n");
  exit(1);
LAB_00103fcd:
  std::__throw_invalid_argument("stod");
LAB_00103fd9:
  std::__throw_out_of_range("stod");
LAB_00103fe5:
  std::__throw_invalid_argument("stoi");
LAB_00103ff1:
  std::__throw_out_of_range("stoi");
  goto LAB_00103ffd;
}

Assistant:

void ANN::load(const std::string& filepath, bool reinitialize){
    std::stringstream stream;
    std::string line;
    uint n_layer;
    std::vector<uint> n_perceptrons, n_weights;
    Matrix weight;

    std::ifstream file(filepath);

    if(!file){
        std::cout<<"ERROR [weight file]: Couldn't load weights!\n";
        exit(1);
    }

    std::getline(file, line);
    n_layer=std::stoi(line);
    n_perceptrons.resize(n_layer);

    if(reinitialize) m_layers.clear();
    for(uint i=0;i<n_layer;++i){
        std::getline(file, line, ',');
        n_perceptrons[i]=std::stoi(line);
        if(reinitialize) insert_layer(i, n_perceptrons[i]);
    }

    for(uint i=0;i<n_layer-1;++i){
        if(reinitialize){
            m_layers[i].weights().set_shape(n_perceptrons[i+1], n_perceptrons[i]);
            m_layers[i].biases().set_shape(1, n_perceptrons[i+1]);
        }
        for(uint j=0;j<n_perceptrons[i+1];++j){
            for(uint k=0;k<n_perceptrons[i];++k){
                std::getline(file, line, ',');
                m_layers[i].weights().set(j, k)=std::stod(line);
            }
        }
        for(uint k=0;k<n_perceptrons[i+1];++k){
            std::getline(file, line, ',');
            m_layers[i].biases().set(0, k)=std::stod(line);
        }   std::getline(file, line);
    }

    file.close();
}